

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,GenerationOptions *generation_options)

{
  byte bVar1;
  ObjectiveCType OVar2;
  FieldGenerator *this;
  MapFieldGenerator *this_00;
  Nonnull<const_char_*> pcVar3;
  undefined8 extraout_RAX;
  bool bVar4;
  void *unaff_R15;
  
  bVar1 = field->field_0x1;
  bVar4 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar4) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar4,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    bVar1 = field->field_0x1;
    OVar2 = GetObjectiveCType((uint)field->type_);
    if ((bVar1 & 0x20) == 0) {
      if (OVar2 == OBJECTIVECTYPE_ENUM) {
        this = (FieldGenerator *)operator_new(0x50);
        EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,generation_options);
      }
      else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
        this = (FieldGenerator *)operator_new(0x50);
        MessageFieldGenerator::MessageFieldGenerator
                  ((MessageFieldGenerator *)this,field,generation_options);
      }
      else {
        OVar2 = GetObjectiveCType((uint)field->type_);
        if ((OVar2 < OBJECTIVECTYPE_STRING) || (OVar2 == OBJECTIVECTYPE_ENUM)) {
          this = (FieldGenerator *)operator_new(0x50);
          PrimitiveFieldGenerator::PrimitiveFieldGenerator
                    ((PrimitiveFieldGenerator *)this,field,generation_options);
        }
        else {
          this = (FieldGenerator *)operator_new(0x50);
          PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                    ((PrimitiveObjFieldGenerator *)this,field,generation_options);
        }
      }
    }
    else if (OVar2 == OBJECTIVECTYPE_ENUM) {
      this = (FieldGenerator *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,generation_options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      if ((field->type_ == '\v') && (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
        this_00 = (MapFieldGenerator *)operator_new(0x58);
        MapFieldGenerator::MapFieldGenerator(this_00,field,generation_options);
        return (FieldGenerator *)this_00;
      }
      this = (FieldGenerator *)operator_new(0x50);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)this,field,generation_options);
    }
    else {
      this = (FieldGenerator *)operator_new(0x50);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,generation_options);
    }
    return this;
  }
  Make();
  operator_delete(unaff_R15,0x50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

FieldGenerator* FieldGenerator::Make(
    const FieldDescriptor* field, const GenerationOptions& generation_options) {
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          return new MapFieldGenerator(field, generation_options);
        } else {
          return new RepeatedMessageFieldGenerator(field, generation_options);
        }
      }
      case OBJECTIVECTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, generation_options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, generation_options);
    }
  }

  switch (GetObjectiveCType(field)) {
    case OBJECTIVECTYPE_MESSAGE: {
      return new MessageFieldGenerator(field, generation_options);
    }
    case OBJECTIVECTYPE_ENUM:
      return new EnumFieldGenerator(field, generation_options);
    default:
      if (IsReferenceType(field)) {
        return new PrimitiveObjFieldGenerator(field, generation_options);
      } else {
        return new PrimitiveFieldGenerator(field, generation_options);
      }
  }
}